

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_finish_flight(SSL_HANDSHAKE *hs)

{
  SSL *ssl_00;
  bool bVar1;
  uint32_t uVar2;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  bVar1 = std::operator!=(&ssl_00->session,(nullptr_t)0x0);
  if (bVar1) {
    hs->state = 0x14;
    hs_local._4_4_ = ssl_hs_ok;
  }
  else {
    bVar1 = tls1_record_handshake_hashes_for_channel_id(hs);
    if (bVar1) {
      hs->state = 0x11;
      uVar2 = SSL_get_mode(ssl_00);
      if ((((uVar2 & 0x80) == 0) || (bVar1 = can_false_start(hs), !bVar1)) ||
         ((*(ushort *)&ssl_00->s3->field_0xdc >> 4 & 1) != 0)) {
        hs_local._4_4_ = ssl_hs_ok;
      }
      else {
        *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfffffdff | 0x200;
        *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xffffdfff | 0x2000;
        hs_local._4_4_ = ssl_hs_early_return;
      }
    }
    else {
      hs_local._4_4_ = ssl_hs_error;
    }
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_finish_flight(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (ssl->session != NULL) {
    hs->state = state_finish_client_handshake;
    return ssl_hs_ok;
  }

  // This is a full handshake. If it involves ChannelID, then record the
  // handshake hashes at this point in the session so that any resumption of
  // this session with ChannelID can sign those hashes.
  if (!tls1_record_handshake_hashes_for_channel_id(hs)) {
    return ssl_hs_error;
  }

  hs->state = state_read_session_ticket;

  if ((SSL_get_mode(ssl) & SSL_MODE_ENABLE_FALSE_START) &&
      can_false_start(hs) &&
      // No False Start on renegotiation (would complicate the state machine).
      !ssl->s3->initial_handshake_complete) {
    hs->in_false_start = true;
    hs->can_early_write = true;
    return ssl_hs_early_return;
  }

  return ssl_hs_ok;
}